

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O2

void __thiscall
DReachabilityPropagator::reverseDFS
          (DReachabilityPropagator *this,int u,vector<bool,_std::allocator<bool>_> *v,int skip_n)

{
  uint uVar1;
  int u_00;
  pointer pvVar2;
  uint *puVar3;
  BoolView *pBVar4;
  bool bVar5;
  size_type __n;
  uint *puVar6;
  reference rVar7;
  
  __n = (size_type)u;
  rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[](v,__n);
  *rVar7._M_p = *rVar7._M_p | rVar7._M_mask;
  pvVar2 = (this->in).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar6 = *(uint **)&pvVar2[__n].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data;
  puVar3 = *(uint **)((long)&pvVar2[__n].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data + 8);
  do {
    if (puVar6 == puVar3) {
      return;
    }
    uVar1 = *puVar6;
    pBVar4 = (this->super_GraphPropagator).es.data;
    if (sat.assigns.data[(uint)pBVar4[uVar1].v] == '\0') {
LAB_001a6d5c:
      u_00 = *(this->super_GraphPropagator).endnodes.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[(int)uVar1].
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      ;
      if (u_00 != skip_n) {
        rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[](v,(long)u_00);
        if ((*rVar7._M_p & rVar7._M_mask) == 0) {
          reverseDFS(this,u_00,v,skip_n);
        }
      }
    }
    else {
      bVar5 = BoolView::isFalse(pBVar4 + uVar1);
      if (!bVar5) goto LAB_001a6d5c;
    }
    puVar6 = puVar6 + 1;
  } while( true );
}

Assistant:

void DReachabilityPropagator::reverseDFS(int u, std::vector<bool>& v, int skip_n) {
	if (DEBUG) {
		std::cout << "Reverse DFS from " << u << '\n';
	}
	v[u] = true;
	for (const int ie : in[u]) {
		if (getEdgeVar(ie).isFixed() && getEdgeVar(ie).isFalse()) {
			continue;
		}
		const int o = getTail(ie);
		if (o == skip_n || v[o]) {
			continue;
		}
		reverseDFS(o, v, skip_n);
	}
}